

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_UShort * ft_var_readpackedpoints(FT_Stream stream,FT_ULong size,FT_UInt *point_cnt)

{
  FT_Memory memory;
  byte bVar1;
  byte bVar2;
  FT_UInt16 FVar3;
  uint uVar4;
  uint uVar5;
  FT_UShort *pFVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  FT_UShort *pFVar10;
  uint uVar11;
  FT_UShort FVar12;
  bool bVar13;
  FT_Error error;
  int local_34;
  
  memory = stream->memory;
  *point_cnt = 0;
  bVar1 = FT_Stream_GetByte(stream);
  if (bVar1 == 0) {
    pFVar10 = (FT_UShort *)0xffffffffffffffff;
  }
  else {
    uVar9 = (ulong)bVar1;
    if ((char)bVar1 < '\0') {
      bVar2 = FT_Stream_GetByte(stream);
      uVar9 = (ulong)((uint)bVar2 | (bVar1 & 0x7f) << 8);
    }
    uVar7 = (uint)uVar9;
    if (size < uVar9) {
      pFVar10 = (FT_UShort *)0x0;
    }
    else {
      pFVar6 = (FT_UShort *)ft_mem_qrealloc(memory,2,0,(ulong)(uVar7 + 1),(void *)0x0,&local_34);
      pFVar10 = (FT_UShort *)0x0;
      if ((local_34 == 0) && (*point_cnt = uVar7, pFVar10 = pFVar6, uVar7 != 0)) {
        FVar12 = 0;
        uVar4 = 0;
        do {
          bVar1 = FT_Stream_GetByte(stream);
          uVar11 = (uint)bVar1;
          uVar8 = uVar4 + 1;
          if ((char)bVar1 < '\0') {
            FVar3 = FT_Stream_GetUShort(stream);
            FVar12 = FVar12 + FVar3;
            pFVar6[uVar4] = FVar12;
            if ((bVar1 & 0x7f) != 0) {
              uVar8 = 1;
              do {
                FVar3 = FT_Stream_GetUShort(stream);
                FVar12 = FVar12 + FVar3;
                pFVar6[uVar4 + uVar8] = FVar12;
                uVar5 = uVar8 + 1;
                if (uVar7 <= uVar4 + uVar8 + 1) break;
                bVar13 = uVar8 < (uVar11 & 0x7f);
                uVar8 = uVar5;
              } while (bVar13);
              goto LAB_0025ae69;
            }
          }
          else {
            bVar1 = FT_Stream_GetByte(stream);
            FVar12 = FVar12 + bVar1;
            pFVar6[uVar4] = FVar12;
            if (uVar11 != 0) {
              uVar8 = 1;
              do {
                bVar1 = FT_Stream_GetByte(stream);
                FVar12 = FVar12 + bVar1;
                pFVar6[uVar4 + uVar8] = FVar12;
                uVar5 = uVar8 + 1;
                if (uVar7 <= uVar4 + uVar8 + 1) break;
                bVar13 = uVar8 < uVar11;
                uVar8 = uVar5;
              } while (bVar13);
LAB_0025ae69:
              uVar8 = uVar4 + uVar5;
            }
          }
          uVar4 = uVar8;
        } while (uVar4 < uVar7);
      }
    }
  }
  return pFVar10;
}

Assistant:

static FT_UShort*
  ft_var_readpackedpoints( FT_Stream  stream,
                           FT_ULong   size,
                           FT_UInt   *point_cnt )
  {
    FT_UShort *points = NULL;
    FT_UInt    n;
    FT_UInt    runcnt;
    FT_UInt    i, j;
    FT_UShort  first;
    FT_Memory  memory = stream->memory;
    FT_Error   error;


    *point_cnt = 0;

    n = FT_GET_BYTE();
    if ( n == 0 )
      return ALL_POINTS;

    if ( n & GX_PT_POINTS_ARE_WORDS )
    {
      n  &= GX_PT_POINT_RUN_COUNT_MASK;
      n <<= 8;
      n  |= FT_GET_BYTE();
    }

    if ( n > size )
    {
      FT_TRACE1(( "ft_var_readpackedpoints: number of points too large\n" ));
      return NULL;
    }

    /* in the nested loops below we increase `i' twice; */
    /* it is faster to simply allocate one more slot    */
    /* than to add another test within the loop         */
    if ( FT_QNEW_ARRAY( points, n + 1 ) )
      return NULL;

    *point_cnt = n;

    first = 0;
    i     = 0;
    while ( i < n )
    {
      runcnt = FT_GET_BYTE();
      if ( runcnt & GX_PT_POINTS_ARE_WORDS )
      {
        runcnt     &= GX_PT_POINT_RUN_COUNT_MASK;
        first      += FT_GET_USHORT();
        points[i++] = first;

        /* first point not included in run count */
        for ( j = 0; j < runcnt; j++ )
        {
          first      += FT_GET_USHORT();
          points[i++] = first;
          if ( i >= n )
            break;
        }
      }
      else
      {
        first      += FT_GET_BYTE();
        points[i++] = first;

        for ( j = 0; j < runcnt; j++ )
        {
          first      += FT_GET_BYTE();
          points[i++] = first;
          if ( i >= n )
            break;
        }
      }
    }

    return points;
  }